

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall KktCheck::chDualFeas(KktCheck *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  bool bVar8;
  ostream *poVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  
  this->i = 0;
  if (this->numCol < 1) {
    bVar8 = true;
  }
  else {
    iVar10 = 0;
    bVar8 = true;
    do {
      pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar14 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10];
      if ((((dVar14 != -1e+200) || (NAN(dVar14))) || (dVar15 = pdVar4[iVar10], dVar15 != 1e+200)) ||
         (NAN(dVar15))) {
        dVar15 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10];
        dVar2 = pdVar4[iVar10];
        if ((dVar15 != dVar14) || (dVar2 <= dVar14)) {
          if ((dVar15 == dVar2) &&
             ((dVar14 < dVar2 &&
              (dVar14 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar10],
              this->tol <= dVar14 && dVar14 != this->tol)))) {
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: x[",0x19);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]=",2);
              poVar9 = std::ostream::_M_insert<double>
                                 ((this->colValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"=u[",3);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,(this->cIndexRev).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[this->i]);
              lVar11 = 5;
              pcVar12 = "], z[";
              goto LAB_0014f5ca;
            }
            goto LAB_0014f65c;
          }
        }
        else {
          dVar14 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar10];
          if ((dVar14 < 0.0) && (dVar14 = ABS(dVar14), this->tol <= dVar14 && dVar14 != this->tol))
          {
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: l[",0x19);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]=",2);
              poVar9 = std::ostream::_M_insert<double>
                                 ((this->colLower).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," = x[",5);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,(this->cIndexRev).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]=",2);
              poVar9 = std::ostream::_M_insert<double>
                                 ((this->colValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              lVar11 = 4;
              pcVar12 = ", z[";
LAB_0014f5ca:
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,lVar11);
              iVar10 = (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[this->i];
              goto LAB_0014f5e0;
            }
LAB_0014f65c:
            bVar8 = false;
          }
        }
      }
      else {
        dVar14 = ABS((this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10]);
        if (this->tol <= dVar14 && dVar14 != this->tol) {
          if (this->print != 1) goto LAB_0014f65c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[",0x21);
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]=",2);
          poVar9 = std::ostream::_M_insert<double>
                             ((this->colValue).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", u=inf, z[",0xb);
          iVar10 = this->i;
LAB_0014f5e0:
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]=",2);
          poVar9 = std::ostream::_M_insert<double>
                             ((this->colDual).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          bVar8 = false;
        }
      }
      iVar10 = this->i + 1;
      this->i = iVar10;
    } while (iVar10 < this->numCol);
  }
  this->i = 0;
  if (0 < this->numRow) {
    iVar10 = 0;
    do {
      lVar11 = (long)iVar10;
      piVar5 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = piVar5[lVar11];
      lVar13 = (long)iVar10;
      this->k = iVar10;
      dVar14 = 0.0;
      if (iVar10 < piVar5[lVar11 + 1]) {
        piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar10 = iVar10 + 1;
          dVar14 = dVar14 + pdVar7[piVar6[lVar13]] * pdVar4[lVar13];
          lVar13 = lVar13 + 1;
          this->k = iVar10;
        } while (lVar13 < piVar5[lVar11 + 1]);
      }
      dVar15 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      dVar2 = this->tol;
      if (dVar2 <= ABS(dVar15 - dVar14)) {
LAB_0014f770:
        if ((dVar14 <= dVar15) ||
           (dVar2 <= ABS(dVar14 - (this->rowUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar11]))) {
          if ((dVar15 < dVar14 + dVar2) &&
             (dVar14 < (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11] + dVar2)) {
            dVar15 = ABS((this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar11]);
            goto LAB_0014f7e7;
          }
        }
        else {
          pdVar1 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar11;
          if (*pdVar1 <= -dVar2 && -dVar2 != *pdVar1) goto LAB_0014f7f1;
        }
      }
      else {
        dVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        if (dVar2 <= ABS(dVar3 - dVar14)) {
          if (dVar3 <= dVar14) goto LAB_0014f770;
          dVar15 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
LAB_0014f7e7:
          if (dVar2 < dVar15) {
LAB_0014f7f1:
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,": L= ",5);
              poVar9 = std::ostream::_M_insert<double>
                                 ((this->rowLower).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", Ax=",5);
              poVar9 = std::ostream::_M_insert<double>(dVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", U=",4);
              poVar9 = std::ostream::_M_insert<double>
                                 ((this->rowUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,", y=",4);
              poVar9 = std::ostream::_M_insert<double>
                                 ((this->rowDual).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            bVar8 = false;
          }
        }
      }
      iVar10 = this->i + 1;
      this->i = iVar10;
    } while (iVar10 < this->numRow);
  }
  if (bVar8) {
    if (this->print == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Dual feasible.\n",0xf);
      return;
    }
  }
  else {
    if (this->print == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"KKT check error: Dual feasibility fail.\n",0x28);
    }
    this->istrueGlb = true;
  }
  return;
}

Assistant:

void KktCheck::chDualFeas() {
	bool istrue = true;
	
	//check values of z_j are dual feasible
	for (i=0; i<numCol;i++) {
		// j not in L or U
		if (colLower[i] == -HSOL_CONST_INF && colUpper[i] == HSOL_CONST_INF) {
			if (abs(colDual[i]) > tol) {
				if (print == 1) 
					cout<<"Dual feasibility fail: l=-inf, x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l=-inf, x["<<i<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in L: x=l and l<u
		else if (colValue[i] == colLower[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]<0 && abs(colDual[i]) > tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: l["<<cIndexRev[i]<<"]="<<colLower[i]<<" = x["<<cIndexRev[i]<<"]="<<colValue[i]<<", z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l["<<i<<"]="<<colLower[i]<<" = x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in U: x=u and l<u
		else if (colValue[i] == colUpper[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]>tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<"=u["<<cIndexRev[i]<<"], z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: x["<<i<<"]="<<colValue[i]<<"=u["<<i<<"], z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
	}
	
	//check values of y_i are dual feasible
	for (i=0; i<numRow;i++) {
		double rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++)
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		// L = Ax = U can be any sign
		if (abs(rowLower[i] - rowV) < tol && abs(rowUpper[i] - rowV) < tol) {
		}
		// L = Ax < U
		else if (abs(rowLower[i] - rowV) < tol && rowV < rowUpper[i]) {

			if (rowDual[i] > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax = U
		else if (rowLower[i] < rowV && abs(rowV - rowUpper[i]) < tol) {
			//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
			if (rowDual[i] < -tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax < U
		else if ((rowLower[i] < (rowV+tol)) && (rowV < (rowUpper[i]+tol))) {
			if (abs(rowDual[i]) > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;istrue = false;
				istrue = false;
			}
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Dual feasible.\n";
	}
	else  {
		if (print == 1) 
			cout<<"KKT check error: Dual feasibility fail.\n";
		istrueGlb = true;
	}
	
}